

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcCallContext::sendRedirectReturn
          (RpcCallContext *this)

{
  bool bVar1;
  undefined8 *puVar2;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> message;
  DebugExpression<bool_&> _kjCondition;
  AnswerId *local_88;
  Fault f;
  Array<unsigned_int> local_48;
  Builder local_28;
  
  _kjCondition.value = &this->redirectResults;
  if (this->redirectResults == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
               ,0xc94,FAILED,"redirectResults","_kjCondition,",&_kjCondition);
    kj::_::Debug::Fault::fatal(&f);
  }
  bVar1 = (this->hints).onlyPromisePipeline;
  f.exception._0_1_ = bVar1 ^ 1;
  if (bVar1 == false) {
    if (this->responseSent == false) {
      this->responseSent = true;
      puVar2 = *(undefined8 **)((long)&(((this->connectionState).ptr)->connection).field_1 + 0x10);
      (**(code **)*puVar2)(&message,puVar2,6);
      (**(message.ptr)->_vptr_OutgoingRpcMessage)(&local_28);
      AnyPointer::Builder::initAs<capnp::rpc::Message>
                ((BuilderFor<capnp::rpc::Message> *)&f,&local_28);
      rpc::Message::Builder::initReturn((Builder *)&_kjCondition,(Builder *)&f);
      *local_88 = this->answerId;
      *(byte *)(local_88 + 1) = (byte)local_88[1] | 1;
      *(undefined2 *)((long)local_88 + 6) = 3;
      (*(message.ptr)->_vptr_OutgoingRpcMessage[2])();
      local_48.ptr = (uint *)0x0;
      local_48.size_ = 0;
      local_48.disposer = (ArrayDisposer *)0x0;
      cleanupAnswerTable(this,&local_48,false);
      kj::Array<unsigned_int>::~Array(&local_48);
      kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::dispose(&message);
    }
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            ((Fault *)&_kjCondition,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
             ,0xc95,FAILED,"!hints.onlyPromisePipeline","_kjCondition,",(DebugExpression<bool> *)&f)
  ;
  kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
}

Assistant:

void sendRedirectReturn() {
      KJ_ASSERT(redirectResults);
      KJ_ASSERT(!hints.onlyPromisePipeline);

      if (isFirstResponder()) {
        auto message = connectionState->connection.get<Connected>().connection
            ->newOutgoingMessage(messageSizeHint<rpc::Return>());
        auto builder = message->getBody().initAs<rpc::Message>().initReturn();

        builder.setAnswerId(answerId);
        builder.setReleaseParamCaps(false);
        builder.setResultsSentElsewhere();

        // TODO(perf): Could `noFinishNeeded` be used here? The `Finish` messages are pretty
        //   redundant after a redirect, but as this case is less common and more complicated I
        //   don't want to fully think through the implications right now.

        message->send();

        cleanupAnswerTable(nullptr, false);
      }
    }